

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessSamplersTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::Samplers::DefaultsTest::testSamplerFloatVectorParameter
          (DefaultsTest *this,GLenum pname,GLfloat *expected_value)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  char *__s;
  size_t sVar2;
  float fVar3;
  float fVar4;
  GLfloat value [4];
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [8];
  _func_int **local_1a0;
  ios_base local_130 [264];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_1b8 = -1.0;
  fStack_1b4 = -1.0;
  fStack_1b0 = -1.0;
  fStack_1ac = -1.0;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0xa48))(this->m_sampler_dsa,pname,&local_1b8);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"glGetSamplerParameterfv have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessSamplersTests.cpp"
                  ,0x14e);
  fVar3 = *expected_value - local_1b8;
  fVar4 = -fVar3;
  if (-fVar3 <= fVar3) {
    fVar4 = fVar3;
  }
  if (fVar4 <= 0.015625) {
    fVar3 = expected_value[1] - fStack_1b4;
    fVar4 = -fVar3;
    if (-fVar3 <= fVar3) {
      fVar4 = fVar3;
    }
    if (fVar4 <= 0.015625) {
      fVar3 = expected_value[2] - fStack_1b0;
      fVar4 = -fVar3;
      if (-fVar3 <= fVar3) {
        fVar4 = fVar3;
      }
      if (fVar4 <= 0.015625) {
        fVar3 = expected_value[3] - fStack_1ac;
        fVar4 = -fVar3;
        if (-fVar3 <= fVar3) {
          fVar4 = fVar3;
        }
        if (fVar4 <= 0.015625) {
          return true;
        }
      }
    }
  }
  local_1a8 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a0,"glGetSamplerParameterfv with parameter ",0x27);
  __s = glu::getTextureParameterName(pname);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(ostringstream *)&local_1a0 + (int)local_1a0[-3]);
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,__s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0," has returned [",0xf);
  std::ostream::_M_insert<double>((double)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,", ",2);
  std::ostream::_M_insert<double>((double)fStack_1b4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,", ",2);
  std::ostream::_M_insert<double>((double)fStack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,", ",2);
  std::ostream::_M_insert<double>((double)fStack_1ac);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"], however ",0xb);
  std::ostream::_M_insert<void_const*>((ostringstream *)&local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0," was expected.",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  std::ios_base::~ios_base(local_130);
  return false;
}

Assistant:

bool DefaultsTest::testSamplerFloatVectorParameter(glw::GLenum pname, glw::GLfloat expected_value[4])
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get data. */
	glw::GLfloat value[4] = { -1.0, -1.0, -1.0, -1.0 };

	gl.getSamplerParameterfv(m_sampler_dsa, pname, value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetSamplerParameterfv have failed");

	if ((de::abs(expected_value[0] - value[0]) > 0.015625f /* Precision */) ||
		(de::abs(expected_value[1] - value[1]) > 0.015625f /* Precision */) ||
		(de::abs(expected_value[2] - value[2]) > 0.015625f /* Precision */) ||
		(de::abs(expected_value[3] - value[3]) > 0.015625f /* Precision */))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "glGetSamplerParameterfv with parameter "
											<< glu::getTextureParameterName(pname) << " has returned [" << value[0]
											<< ", " << value[1] << ", " << value[2] << ", " << value[3] << "], however "
											<< expected_value << " was expected." << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}